

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzero.cpp
# Opt level: O1

Machine * setVariable(Machine *__return_storage_ptr__,Machine *m,Register r)

{
  size_type *psVar1;
  Hix HVar2;
  undefined8 uVar3;
  mapped_type *pmVar4;
  mapped_type *pmVar5;
  long local_78;
  Hcell h;
  key_type local_34 [2];
  Register r_local;
  
  psVar1 = &h.f_.id._M_string_length;
  h.f_.id._M_string_length._0_4_ = 0x62726167;
  h.f_.id._M_dataplus._M_p = (pointer)0x7;
  h.f_.id._M_string_length._4_4_ = 0x656761;
  h.f_.id.field_2._8_4_ = 0xffffffd6;
  local_78 = (ulong)(uint)(m->h).hix << 0x20;
  h._0_8_ = psVar1;
  h.f_._32_8_ = __return_storage_ptr__;
  local_34[0].r = r.r;
  pmVar4 = std::map<Hix,_Hcell,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>::
           operator[](&m->heap,&m->h);
  pmVar4->tag = (undefined4)local_78;
  pmVar4->hix_ = (Hix)local_78._4_4_;
  std::__cxx11::string::operator=((string *)&pmVar4->f_,(string *)&h);
  (pmVar4->f_).arity = h.f_.id.field_2._8_4_;
  pmVar5 = std::
           map<Register,_Hcell,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
           ::operator[](&m->regval,local_34);
  HVar2.hix = (pmVar4->hix_).hix;
  pmVar5->tag = pmVar4->tag;
  pmVar5->hix_ = (Hix)HVar2.hix;
  std::__cxx11::string::_M_assign((string *)&pmVar5->f_);
  (pmVar5->f_).arity = (pmVar4->f_).arity;
  if ((size_type *)h._0_8_ != psVar1) {
    operator_delete((void *)h._0_8_,
                    CONCAT44(h.f_.id._M_string_length._4_4_,(undefined4)h.f_.id._M_string_length) +
                    1);
  }
  uVar3 = h.f_._32_8_;
  (m->h).hix = (m->h).hix + 1;
  std::_Rb_tree_header::_Rb_tree_header
            ((_Rb_tree_header *)(h.f_._32_8_ + 8),&(m->heap)._M_t._M_impl.super__Rb_tree_header);
  std::_Rb_tree_header::_Rb_tree_header
            ((_Rb_tree_header *)(uVar3 + 0x38),&(m->regval)._M_t._M_impl.super__Rb_tree_header);
  *(Mode *)(uVar3 + 0x68) = m->mode;
  *(undefined8 *)(uVar3 + 0x60) = *(undefined8 *)&m->h;
  return (Machine *)uVar3;
}

Assistant:

Machine setVariable(Machine m, Register r) {
    m.regval[r] = m.heap[m.h] = Hcell::ref(m.h);
    m.h += 1;
    return m;
}